

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_> * __thiscall
ary::BinaryPatternLocalizer::localize
          (vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
           *__return_storage_ptr__,BinaryPatternLocalizer *this,Mat *image)

{
  Mat *pMVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  Size SVar5;
  double dVar6;
  uint uVar7;
  PlanarLocalization *this_00;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int in_R8D;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  double dVar18;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> polycont;
  vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_> *localizations;
  CameraPosition camera;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> refined;
  int orientation;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> rotated;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> roi;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  double confidence;
  Rect box;
  Mat contourMat;
  Mat rectifiedPatch;
  int *local_2d8;
  int *piStack_2d0;
  uchar *local_2c8;
  vector<cv::Ptr<ary::Localization>,std::allocator<cv::Ptr<ary::Localization>>> *local_2b8;
  _InputArray local_2b0;
  MatSize local_298;
  size_t *psStack_290;
  size_t *local_288;
  _OutputArray local_278;
  int local_25c;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_258;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_238;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_218;
  Mat *local_200;
  PlanarLocalization *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f0;
  double local_1e8;
  Size2f local_1e0;
  Rect local_1d8;
  undefined1 local_1c8 [8];
  undefined8 uStack_1c0;
  Size SStack_1b8;
  Size SStack_1b0;
  uchar *local_1a8;
  uchar *puStack_1a0;
  MatAllocator *local_198;
  UMatData *pUStack_190;
  MatSize local_188;
  size_t *local_180;
  size_t local_178 [3];
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  undefined8 local_140;
  undefined8 local_138;
  _InputArray local_130;
  undefined1 local_118 [8];
  Mat *pMStack_110;
  int *local_108;
  int *piStack_100;
  int *local_f8;
  int *piStack_f0;
  MatAllocator *local_e8;
  UMatData *pUStack_e0;
  MatSize local_d8;
  size_t *local_d0;
  size_t local_c8 [2];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_b8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  uchar *puStack_80;
  
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8 = (vector<cv::Ptr<ary::Localization>,std::allocator<cv::Ptr<ary::Localization>>> *)
              __return_storage_ptr__;
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)&((BinaryPatternLocalizer *)
                 local_238.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start)->patterns;
  (((BinaryPatternLocalizer *)
   local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
   super__Vector_impl_data._M_start)->super_Localizer).super_CameraUser._vptr_CameraUser =
       (_func_int **)0x0;
  (((BinaryPatternLocalizer *)
   local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
   super__Vector_impl_data._M_start)->super_Localizer).super_CameraUser.camera.
  super_shared_ptr<ary::CameraModel>.
  super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (((BinaryPatternLocalizer *)
   local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
   super__Vector_impl_data._M_start)->super_Localizer).super_CameraUser.camera.
  super_shared_ptr<ary::CameraModel>.
  super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   &((BinaryPatternLocalizer *)
    local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start)->block_size = 0;
  local_288 = (size_t *)0x0;
  local_298.p = (int *)0x0;
  psStack_290 = (size_t *)0x0;
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_298.p = (int *)operator_new(0x20);
  psStack_290 = (size_t *)(local_298.p + 8);
  local_298.p[4] = 0;
  local_298.p[5] = 0;
  local_298.p[6] = 0;
  local_298.p[7] = 0;
  local_298.p[0] = 0;
  local_298.p[1] = 0;
  local_298.p[2] = 0;
  local_298.p[3] = 0;
  local_258.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288 = psStack_290;
  local_258.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  local_258.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((long)local_258.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0x20);
  *(int *)((long)local_258.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x10) = 0;
  *(int *)((long)local_258.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x14) = 0;
  *(int *)((long)local_258.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x18) = 0;
  *(int *)((long)local_258.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x1c) = 0;
  *(int *)((long)local_258.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0) = 0;
  *(int *)((long)local_258.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 4) = 0;
  *(int *)((long)local_258.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 8) = 0;
  *(int *)((long)local_258.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0xc) = 0;
  local_218.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8 = (uchar *)0x0;
  local_2d8 = (int *)0x0;
  piStack_2d0 = (int *)0x0;
  local_258.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_258.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((image->flags & 0xff8U) == 0x10) {
    puStack_80 = (uchar *)0x0;
    local_90._0_4_ = 0x1010000;
    uStack_1c0 = &this->grayImage;
    SStack_1b8.width = 0;
    SStack_1b8.height = 0;
    local_1c8._0_4_ = 0x2010000;
    local_90._8_8_ = image;
    cv::cvtColor((cv *)local_90,(_InputArray *)local_1c8,(_OutputArray *)0x6,0,in_R8D);
  }
  else {
    local_90._8_8_ = &this->grayImage;
    puStack_80 = (uchar *)0x0;
    local_90._0_4_ = 0x2010000;
    cv::Mat::copyTo((_OutputArray *)image);
  }
  local_200 = &this->grayImage;
  puStack_80 = (uchar *)0x0;
  local_90._0_4_ = 0x1010000;
  pMVar1 = &this->binImage;
  SStack_1b8.width = 0;
  SStack_1b8.height = 0;
  local_1c8._0_4_ = 0x2010000;
  uStack_1c0 = pMVar1;
  local_90._8_8_ = local_200;
  cv::adaptiveThreshold
            ((_InputArray *)local_90,(_OutputArray *)local_1c8,255.0,1,1,(int)this->block_size,
             (double)(int)this->threshold);
  local_108 = (int *)0x0;
  local_118._0_4_ = 0x1010000;
  local_2b0.sz.width = 0;
  local_2b0.sz.height = 0;
  local_2b0.flags = 0x2010000;
  local_2b0.obj = pMVar1;
  pMStack_110 = pMVar1;
  cv::Mat::Mat((Mat *)local_90);
  local_278.super__InputArray.sz.width = 0;
  local_278.super__InputArray.sz.height = 0;
  local_278.super__InputArray.flags = 0x1010000;
  local_98 = 0xffffffffffffffff;
  local_1c8._0_4_ = -1;
  local_1c8._4_4_ = 0x7fefffff;
  uStack_1c0 = (Mat *)0x7fefffffffffffff;
  SStack_1b8.width = -1;
  SStack_1b8.height = 0x7fefffff;
  SStack_1b0.width = -1;
  SStack_1b0.height = 0x7fefffff;
  local_278.super__InputArray.obj = (Mat *)local_90;
  cv::dilate(local_118,&local_2b0,&local_278,&local_98,1,0,(_OutputArray *)local_1c8);
  cv::Mat::~Mat((Mat *)local_90);
  iVar11 = (this->binImage).cols + (this->binImage).rows;
  puStack_80 = (uchar *)0x0;
  local_90._0_4_ = 0x1010000;
  SStack_1b8.width = 0;
  SStack_1b8.height = 0;
  local_1c8._0_4_ = -0x7dfbfff4;
  uStack_1c0 = (Mat *)&local_218;
  local_a0 = 0;
  local_90._8_8_ = pMVar1;
  cv::findContours(local_90,(Mat *)local_1c8,1);
  cv::Mat::Mat((Mat *)local_90,100,100,0);
  *(undefined8 *)local_2b8 = 0;
  *(pointer *)(local_2b8 + 8) = (pointer)0x0;
  *(pointer *)(local_2b8 + 0x10) = (pointer)0x0;
  if (local_218.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_218.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar9 = iVar11 / 2;
    local_150 = (double)(iVar11 / 0xc);
    iVar11 = iVar9 * 4;
    local_158 = (double)iVar11;
    local_160 = (double)(iVar9 * iVar11);
    uVar17 = 0;
    do {
      local_180 = local_178;
      local_1c8._0_4_ = 0x42ff400c;
      local_1c8._4_4_ = 2;
      uVar10 = (long)local_218.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17].
                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_218.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17].
                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_188.p = (int *)&uStack_1c0;
      uStack_1c0 = (Mat *)CONCAT44(1,(int)(uVar10 >> 3));
      local_198 = (MatAllocator *)0x0;
      pUStack_190 = (UMatData *)0x0;
      puStack_1a0 = (uchar *)0x0;
      SStack_1b0.width = 0;
      SStack_1b0.height = 0;
      local_178[0] = 0;
      local_178[1] = 0;
      SVar5 = *(Size *)(local_218.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar17);
      if (SVar5 != (Size)local_218.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar17].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish) {
        local_178[1] = 8;
        local_178[0] = 8;
        puStack_1a0 = (uchar *)(((long)(uVar10 * 0x20000000) >> 0x1d & 0xfffffffffffffff8U) +
                               (long)SVar5);
        SStack_1b0 = SVar5;
      }
      local_2b0.sz.width = 0;
      local_2b0.sz.height = 0;
      local_2b0.flags = 0x1010000;
      local_2b0.obj = (Mat *)local_1c8;
      SStack_1b8 = SStack_1b0;
      local_1a8 = puStack_1a0;
      dVar18 = (double)cv::arcLength(&local_2b0,true);
      if ((local_150 < dVar18) && (dVar18 < local_158)) {
        if (piStack_2d0 != local_2d8) {
          piStack_2d0 = local_2d8;
        }
        local_2b0.sz.width = 0;
        local_2b0.sz.height = 0;
        local_2b0.flags = 0x1010000;
        local_278.super__InputArray.sz.width = 0;
        local_278.super__InputArray.sz.height = 0;
        local_278.super__InputArray.flags = 0x8203000c;
        local_278.super__InputArray.obj = &local_2d8;
        local_2b0.obj = (Mat *)local_1c8;
        cv::approxPolyDP(&local_2b0,&local_278,dVar18 * 0.02,true);
        lVar14 = (long)piStack_2d0 - (long)local_2d8;
        if (lVar14 == 0x20) {
          local_118._0_4_ = 0x42ff400c;
          local_118._4_4_ = 2;
          pMStack_110 = (Mat *)0x100000004;
          local_d8.p = (int *)&pMStack_110;
          local_e8 = (MatAllocator *)0x0;
          pUStack_e0 = (UMatData *)0x0;
          piStack_f0 = (int *)0x0;
          piStack_100 = (int *)0x0;
          local_d0 = local_c8;
          local_c8[0] = 0;
          local_c8[1] = 0;
          if (local_2d8 != piStack_2d0) {
            local_c8[1] = 8;
            local_c8[0] = 8;
            piStack_100 = local_2d8;
            piStack_f0 = local_2d8 + 8;
          }
          local_130.sz.width = 0;
          local_130.sz.height = 0;
          local_130.flags = 0x1010000;
          local_130.obj = local_118;
          local_108 = piStack_100;
          local_f8 = piStack_f0;
          uVar7 = cv::isContourConvex(&local_130);
          uVar10 = (ulong)uVar7;
        }
        else {
          uVar10 = 0;
        }
        if (lVar14 == 0x20) {
          cv::Mat::~Mat((Mat *)local_118);
        }
        if ((char)uVar10 != '\0') {
          lVar14 = (long)piStack_2d0 - (long)local_2d8 >> 3;
          if (piStack_2d0 == local_2d8) goto LAB_00115348;
          iVar11 = *local_2d8;
          iVar9 = local_2d8[1];
          lVar13 = 1;
          iVar12 = iVar9;
          iVar16 = iVar11;
          do {
            if (lVar14 + (ulong)(lVar14 == 0) == lVar13) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
              goto LAB_0011530d;
            }
            iVar3 = local_2d8[lVar13 * 2];
            if (iVar3 < iVar16) {
              iVar16 = iVar3;
            }
            iVar4 = local_2d8[lVar13 * 2 + 1];
            if (iVar11 < iVar3) {
              iVar11 = iVar3;
            }
            if (iVar4 < iVar12) {
              iVar12 = iVar4;
            }
            if (iVar9 < iVar4) {
              iVar9 = iVar4;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
          local_1d8.width = (iVar11 - iVar16) + 1;
          local_1d8.height = (iVar9 - iVar12) + 1;
          uVar15 = 0xffffffff;
          uVar10 = 0;
          dVar18 = local_160;
          local_1d8.x = iVar16;
          local_1d8.y = iVar12;
          do {
            if ((ulong)((long)piStack_2d0 - (long)local_2d8 >> 3) <= uVar10) goto LAB_0011530d;
            dVar6 = (double)local_2d8[uVar10 * 2] * (double)local_2d8[uVar10 * 2] +
                    (double)local_2d8[uVar10 * 2 + 1] * (double)local_2d8[uVar10 * 2 + 1];
            if (dVar6 < 0.0) {
              local_148 = dVar18;
              dVar6 = sqrt(dVar6);
              dVar18 = local_148;
            }
            else {
              dVar6 = SQRT(dVar6);
            }
            if (dVar6 < dVar18) {
              uVar15 = uVar10 & 0xffffffff;
              dVar18 = dVar6;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != 4);
          lVar14 = 0;
          do {
            if ((long)piStack_2d0 - (long)local_2d8 >> 3 == lVar14) goto LAB_0011531e;
            iVar11 = local_2d8[lVar14 * 2 + 1];
            local_298.p[lVar14 * 2] = (int)(float)local_2d8[lVar14 * 2];
            local_298.p[lVar14 * 2 + 1] = (int)(float)iVar11;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          local_2b0.sz.width = 0;
          local_2b0.sz.height = 0;
          local_2b0.flags = 0x1010000;
          local_2b0.obj = local_200;
          local_278.super__InputArray.sz.width = 0;
          local_278.super__InputArray.sz.height = 0;
          local_278.super__InputArray.flags = 0x8303000d;
          local_278.super__InputArray.obj = &local_298;
          local_138 = 0x300000003;
          local_140 = 0xffffffffffffffff;
          cv::cornerSubPix(0,&local_2b0,&local_278,&local_138,&local_140,0x300000001);
          iVar11 = (int)uVar15 + 4;
          lVar14 = 0;
          do {
            uVar10 = (ulong)(iVar11 % 4);
            if ((ulong)((long)psStack_290 - (long)local_298.p >> 3) <= uVar10) goto LAB_0011532c;
            fVar2 = (float)local_298.p[uVar10 * 2 + 1];
            *(float *)(&(((Localizer *)
                         &(local_238.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->x)->super_CameraUser).
                        _vptr_CameraUser + lVar14) = (float)local_298.p[uVar10 * 2] - (float)iVar16;
            *(float *)((long)&(((Localizer *)
                               &(local_238.
                                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->x)->super_CameraUser).
                              _vptr_CameraUser + lVar14 * 8 + 4) = fVar2 - (float)iVar12;
            lVar14 = lVar14 + 1;
            iVar11 = iVar11 + -1;
          } while (lVar14 != 4);
          rectifyPattern((BinaryPatternLocalizer *)
                         local_238.
                         super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start,local_200,&local_238,&local_1d8,
                         (Mat *)local_90);
          local_1e8 = 0.0;
          uVar7 = identifyPattern(this,(Mat *)local_90,&local_1e8,&local_25c);
          if (-1 < (int)uVar7) {
            iVar11 = ((int)uVar15 - local_25c) + 8;
            lVar14 = 0;
            do {
              uVar10 = (ulong)(iVar11 % 4);
              if ((ulong)((long)psStack_290 - (long)local_298.p >> 3) <= uVar10) goto LAB_0011533a;
              *(int *)((long)local_258.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar14 * 2 * 4) =
                   local_298.p[uVar10 * 2];
              *(int *)((long)local_258.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + (lVar14 * 2 + 1) * 4) =
                   local_298.p[uVar10 * 2 + 1];
              lVar14 = lVar14 + 1;
              iVar11 = iVar11 + -1;
            } while (lVar14 != 4);
            calculateExtrinsics((CameraPosition *)&local_2b0,this,
                                (this->patterns).
                                super__Vector_base<ary::BinaryPattern,_std::allocator<ary::BinaryPattern>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar7].size,&local_258);
            this_00 = (PlanarLocalization *)operator_new(0x48);
            local_1e0.width =
                 (this->patterns).
                 super__Vector_base<ary::BinaryPattern,_std::allocator<ary::BinaryPattern>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar7].size;
            local_1e0.height = local_1e0.width;
            std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                      (&local_b8,&local_258);
            PlanarLocalization::PlanarLocalization
                      (this_00,uVar7,(CameraPosition *)&local_2b0,&local_1e0,&local_b8,
                       (float)local_1e8);
            local_1f8 = this_00;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<ary::PlanarLocalization*>(&_Stack_1f0,this_00);
            local_278.super__InputArray._0_8_ = local_1f8;
            local_278.super__InputArray.obj = _Stack_1f0._M_pi;
            local_1f8 = (PlanarLocalization *)0x0;
            _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::vector<cv::Ptr<ary::Localization>,std::allocator<cv::Ptr<ary::Localization>>>::
            emplace_back<cv::Ptr<ary::Localization>>(local_2b8,(Ptr<ary::Localization> *)&local_278)
            ;
            if ((Mat *)local_278.super__InputArray.obj != (Mat *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_278.super__InputArray.obj);
            }
            if ((Mat *)_Stack_1f0._M_pi != (Mat *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1f0._M_pi);
            }
            if (local_b8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b8.
                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
      }
      cv::Mat::~Mat((Mat *)local_1c8);
      uVar17 = (ulong)((int)uVar17 + 1);
      uVar10 = ((long)local_218.
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_218.
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar17 <= uVar10 && uVar10 - uVar17 != 0);
  }
  cv::Mat::~Mat((Mat *)local_90);
  if (local_2d8 != (int *)0x0) {
    operator_delete(local_2d8);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_218);
  if (local_258.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_298.p != (int *)0x0) {
    operator_delete(local_298.p);
  }
  if ((BinaryPatternLocalizer *)
      local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (BinaryPatternLocalizer *)0x0) {
    operator_delete(local_238.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_> *)
         local_2b8;
LAB_0011530d:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
LAB_0011531e:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0011532c:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0011533a:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00115348:
  uVar8 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0);
  if (local_2d8 != (int *)0x0) {
    operator_delete(local_2d8);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_218);
  if (local_258.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_298.p != (int *)0x0) {
    operator_delete(local_298.p);
  }
  if ((BinaryPatternLocalizer *)
      local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (BinaryPatternLocalizer *)0x0) {
    operator_delete(local_238.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar8);
}

Assistant:

vector<SharedLocalization> BinaryPatternLocalizer::localize(const Mat& image) {

	vector<Point2f> roi(4);
	vector<Point2f> refined(4);
    vector<Point2f> rotated(4);

	vector<vector<Point> > contours;
	vector<Point> polycont;

    //binarize image
    if (image.channels() == 3) {
	    cvtColor(image, grayImage, COLOR_BGR2GRAY);
    }
    else {
	    image.copyTo(grayImage);
    }

    adaptiveThreshold(grayImage, binImage, 255, ADAPTIVE_THRESH_GAUSSIAN_C, THRESH_BINARY_INV, block_size, (int) threshold);
    dilate(binImage, binImage, Mat());

	int avsize = (binImage.rows + binImage.cols) / 2;

	//find contours in binary image
	cv::findContours(binImage, contours, RETR_LIST, CHAIN_APPROX_SIMPLE);

	unsigned int i;
	Point p;
	int pMinX, pMinY, pMaxY, pMaxX;
    Mat rectifiedPatch(PATTERN_SIZE, PATTERN_SIZE, CV_8UC1);;

    vector<SharedLocalization> localizations;

	for (i = 0; i < contours.size(); i++) {
		Mat contourMat = Mat (contours[i]);
		const double per = arcLength( contourMat, true);
		//check the perimeter

		if (per > (avsize / 6) && per < (4 * avsize)) {

			polycont.clear();
			approxPolyDP( contourMat, polycont, per * 0.02, true);
			//check rectangularity and convexity
			if (polycont.size() == 4 && isContourConvex(Mat (polycont))) {

				//locate the 2D box of contour,
				p = polycont.at(0);
				pMinX = pMaxX = p.x;
				pMinY = pMaxY = p.y;
				int j;
				for (j = 1; j < 4; j++) {
					p = polycont.at(j);
					if (p.x < pMinX) {
						pMinX = p.x;
					}
					if (p.x > pMaxX) {
						pMaxX = p.x;
					}
					if (p.y < pMinY) {
						pMinY = p.y;
					}
					if (p.y > pMaxY) {
						pMaxY = p.y;
					}
				}
				Rect box(pMinX, pMinY, pMaxX - pMinX + 1, pMaxY - pMinY + 1);

				//find the upper left vertex
				double d;
				double dmin = (4 * avsize * avsize);
				int v1 = -1;
				for (j = 0; j < 4; j++) {
					d = norm(polycont.at(j));
					if (d < dmin) {
						dmin = d;
						v1 = j;
					}
				}

				//store vertices in refinedVertices and enable sub-pixel refinement if you want
				for (j = 0; j < 4; j++) {
					refined[j] = polycont.at(j);
				}

				//refine corners
				cornerSubPix(grayImage, refined, Size(3, 3), Size(-1, -1), TermCriteria(1, 3, 1));

				//rotate vertices based on upper left vertex; this gives you the most trivial homogrpahy
				for (j = 0; j < 4; j++) {
					roi[j] = Point2f(refined.at((4 + v1 - j) % 4).x - pMinX, refined.at((4 + v1 - j) % 4).y - pMinY);
				}

	            //rectify the candidate pattern (find homography and warp the ROI)
	            rectifyPattern(grayImage, roi, box, rectifiedPatch);

	            double confidence = 0;
	            int orientation;

	            int id = identifyPattern(rectifiedPatch, confidence, orientation);
	            //push-back pattern in the stack of foundPatterns and find its extrinsics

	            if (id >= 0) {

		            for (j = 0; j < 4; j++) {
			            rotated[j] = refined.at((8 - orientation + v1 - j) % 4);
		            }

		            //find the transformation (from camera CS to pattern CS)
		            CameraPosition camera = calculateExtrinsics(patterns[id].getSize(), rotated);
		            localizations.push_back(Ptr<PlanarLocalization>(new PlanarLocalization(id, camera, Size2f(patterns[id].getSize(), patterns[id].getSize()), rotated, (float) confidence)));

	            }


			}
		}
	}

    return localizations;
}